

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O1

void Sat_SolverWriteDimacs
               (sat_solver *p,char *pFileName,lit *assumpBegin,lit *assumpEnd,int incrementVars)

{
  clause cVar1;
  FILE *__stream;
  char *pcVar2;
  int iVar3;
  clause *pC;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((long)p->size < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      if (p->levels[lVar4] == 0) {
        iVar3 = iVar3 + (uint)(p->assigns[lVar4] != '\x03');
      }
      lVar4 = lVar4 + 1;
    } while (p->size != lVar4);
  }
  __stream = _stdout;
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"wb");
  }
  if (__stream == (FILE *)0x0) {
    puts("Sat_SolverWriteDimacs(): Cannot open the ouput file.");
    return;
  }
  fprintf(__stream,"p cnf %d %d\n",(ulong)(uint)p->size,
          (ulong)(((p->Mem).nEntries[1] +
                  (int)((ulong)((long)assumpEnd - (long)assumpBegin) >> 2) + iVar3 +
                  (p->Mem).nEntries[0]) - 1));
  if (-1 < (p->Mem).iPage[0]) {
    lVar4 = 0;
    do {
      if (2 < *(p->Mem).pPages[lVar4]) {
        uVar8 = 2;
        do {
          pC = (clause *)((p->Mem).pPages[lVar4] + uVar8);
          if ((lVar4 != 0) || ((int)uVar8 != 2)) {
            Sat_SolverClauseWriteDimacs((FILE *)__stream,pC,incrementVars);
          }
          cVar1 = *pC;
          uVar7 = (int)uVar8 + (((uint)cVar1 & 1) + ((uint)cVar1 >> 0xb) + 2 & 0xfffffffe);
          uVar8 = (ulong)uVar7;
        } while ((int)uVar7 < *(p->Mem).pPages[lVar4]);
      }
      lVar4 = lVar4 + 2;
    } while ((int)lVar4 <= (p->Mem).iPage[0]);
  }
  pcVar5 = " 0";
  if (0 < p->size) {
    pcVar6 = " 0";
    if (incrementVars == 0) {
      pcVar6 = "";
    }
    lVar4 = 0;
    do {
      if ((p->levels[lVar4] == 0) && (p->assigns[lVar4] != '\x03')) {
        pcVar2 = "-";
        if (p->assigns[lVar4] != '\x01') {
          pcVar2 = "";
        }
        fprintf(__stream,"%s%d%s\n",pcVar2,(ulong)((uint)(0 < incrementVars) + (int)lVar4),pcVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->size);
  }
  if (assumpBegin != assumpEnd && assumpBegin != (lit *)0x0) {
    if (incrementVars == 0) {
      pcVar5 = "";
    }
    do {
      pcVar6 = "-";
      if ((*assumpBegin & 1U) == 0) {
        pcVar6 = "";
      }
      fprintf(__stream,"%s%d%s\n",pcVar6,(ulong)((*assumpBegin >> 1) + (uint)(0 < incrementVars)),
              pcVar5);
      assumpBegin = (lit *)((uint *)assumpBegin + 1);
    } while (assumpBegin != assumpEnd);
  }
  fputc(10,__stream);
  if (pFileName == (char *)0x0) {
    return;
  }
  fclose(__stream);
  return;
}

Assistant:

void Sat_SolverWriteDimacs( sat_solver * p, char * pFileName, lit* assumpBegin, lit* assumpEnd, int incrementVars )
{
    Sat_Mem_t * pMem = &p->Mem;
    FILE * pFile;
    clause * c;
    int i, k, nUnits;

    // count the number of unit clauses
    nUnits = 0;
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 )
            nUnits++;

    // start the file
    pFile = pFileName ? fopen( pFileName, "wb" ) : stdout;
    if ( pFile == NULL )
    {
        printf( "Sat_SolverWriteDimacs(): Cannot open the ouput file.\n" );
        return;
    }
//    fprintf( pFile, "c CNF generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "p cnf %d %d\n", p->size, Sat_MemEntryNum(&p->Mem, 0)-1+Sat_MemEntryNum(&p->Mem, 1)+nUnits+(int)(assumpEnd-assumpBegin) );

    // write the original clauses
    Sat_MemForEachClause( pMem, c, i, k )
        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write the learned clauses
//    Sat_MemForEachLearned( pMem, c, i, k )
//        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write zero-level assertions
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 ) // varX
            fprintf( pFile, "%s%d%s\n",
                     (p->assigns[i] == 1)? "-": "",    // var0
                     i + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");

    // write the assump
    if (assumpBegin) {
        for (; assumpBegin != assumpEnd; assumpBegin++) {
            fprintf( pFile, "%s%d%s\n",
                     lit_sign(*assumpBegin)? "-": "",
                     lit_var(*assumpBegin) + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");
        }
    }

    fprintf( pFile, "\n" );
    if ( pFileName ) fclose( pFile );
}